

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O2

void PrintByteCount(int *bytes,int total_size,int *totals)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = 0;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    fprintf(stderr,"| %7d ",(ulong)(uint)bytes[lVar2]);
    iVar1 = bytes[lVar2];
    if (totals != (int *)0x0) {
      totals[lVar2] = totals[lVar2] + iVar1;
    }
    uVar3 = uVar3 + iVar1;
  }
  fprintf(stderr,"| %7d  (%.1f%%)\n",(double)(((float)(int)uVar3 * 100.0) / (float)total_size),
          (ulong)uVar3);
  return;
}

Assistant:

static void PrintByteCount(const int bytes[4], int total_size,
                           int* const totals) {
  int s;
  int total = 0;
  for (s = 0; s < 4; ++s) {
    fprintf(stderr, "| %7d ", bytes[s]);
    total += bytes[s];
    if (totals) totals[s] += bytes[s];
  }
  fprintf(stderr, "| %7d  (%.1f%%)\n", total, 100.f * total / total_size);
}